

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

Bool tidyInitSource(TidyInputSource *source,void *srcData,TidyGetByteFunc gbFunc,
                   TidyUngetByteFunc ugbFunc,TidyEOFFunc endFunc)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(source == (TidyInputSource *)0x0);
  auVar2._4_4_ = -(uint)(srcData == (void *)0x0);
  auVar2._8_4_ = -(uint)(gbFunc == (TidyGetByteFunc)0x0);
  auVar2._12_4_ = -(uint)(ugbFunc == (TidyUngetByteFunc)0x0);
  iVar1 = movmskps(in_EAX,auVar2);
  if (iVar1 == 0 && endFunc != (TidyEOFFunc)0x0) {
    source->sourceData = srcData;
    source->getByte = gbFunc;
    source->ungetByte = ugbFunc;
    source->eof = endFunc;
  }
  return (Bool)(iVar1 == 0 && endFunc != (TidyEOFFunc)0x0);
}

Assistant:

Bool TIDY_CALL tidyInitSource( TidyInputSource*  source,
                               void*             srcData,
                               TidyGetByteFunc   gbFunc,
                               TidyUngetByteFunc ugbFunc,
                               TidyEOFFunc       endFunc )
{
  Bool status = ( source && srcData && gbFunc && ugbFunc && endFunc );

  if ( status )
  {
    source->sourceData = srcData;
    source->getByte    = gbFunc;
    source->ungetByte  = ugbFunc;
    source->eof        = endFunc;
  }

  return status;
}